

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void trial::protocol::serialization::
     save_overloader<trial::protocol::json::basic_oarchive<char>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
     ::save(basic_oarchive<char> *ar,variable *data,uint protocol_version)

{
  bool bVar1;
  type_conflict2 tVar2;
  type_conflict3 tVar3;
  value vVar4;
  type_conflict5 tVar5;
  type_conflict4 tVar6;
  const_reference pbVar7;
  error *this;
  variable *this_00;
  type_conflict8 tVar8;
  pointer ptVar9;
  const_iterator it;
  const_iterator __end4;
  
  this_00 = data;
  vVar4 = dynamic::basic_variable<std::allocator<char>_>::code(data);
  switch(vVar4) {
  case null:
    json::basic_writer<char,_16UL>::null_value(&ar->writer);
    return;
  case boolean:
    it.
    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    .scope._0_1_ = dynamic::basic_variable<std::allocator<char>_>::value<bool>(data);
    json::basic_writer<char,16ul>::value<bool_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(bool *)&it);
    break;
  case signed_char:
    it.
    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    .scope._0_1_ = dynamic::basic_variable<std::allocator<char>_>::value<signed_char>(data);
    json::basic_writer<char,16ul>::value<signed_char_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(char *)&it);
    break;
  case unsigned_char:
    it.
    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    .scope._0_1_ = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_char>(data);
    json::basic_writer<char,16ul>::value<unsigned_char_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(uchar *)&it);
    break;
  case signed_short_integer:
    tVar2 = dynamic::basic_variable<std::allocator<char>_>::value<short>(data);
    it.
    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    .scope._0_2_ = tVar2;
    json::basic_writer<char,16ul>::value<short_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(short *)&it);
    break;
  case unsigned_short_integer:
    tVar3 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_short>(data);
    it.
    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    .scope._0_2_ = tVar3;
    json::basic_writer<char,16ul>::value<unsigned_short_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(unsigned_short *)&it);
    break;
  case signed_integer:
    tVar6 = dynamic::basic_variable<std::allocator<char>_>::value<int>(data);
    it.
    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    .scope._0_4_ = (type_conflict8)tVar6;
    json::basic_writer<char,16ul>::value<int_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(int *)&it);
    break;
  case unsigned_integer:
    tVar5 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_int>(data);
    it.
    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    .scope._0_4_ = (type_conflict8)tVar5;
    json::basic_writer<char,16ul>::value<unsigned_int_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(uint *)&it);
    break;
  case signed_long_integer:
    ptVar9 = (pointer)dynamic::basic_variable<std::allocator<char>_>::value<long>(data);
    it.
    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    .scope = ptVar9;
    json::basic_writer<char,16ul>::value<long_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(long *)&it);
    break;
  case unsigned_long_integer:
    ptVar9 = (pointer)dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long>(data);
    it.
    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    .scope = ptVar9;
    json::basic_writer<char,16ul>::value<unsigned_long_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(unsigned_long *)&it);
    break;
  case signed_long_long_integer:
    ptVar9 = (pointer)dynamic::basic_variable<std::allocator<char>_>::value<long_long>(data);
    it.
    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    .scope = ptVar9;
    json::basic_writer<char,16ul>::value<long_long_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(longlong *)&it);
    break;
  case unsigned_long_long_integer:
    ptVar9 = (pointer)dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long_long>
                                (data);
    it.
    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    .scope = ptVar9;
    json::basic_writer<char,16ul>::value<unsigned_long_long_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(unsigned_long_long *)&it);
    break;
  case float_number:
    tVar8 = dynamic::basic_variable<std::allocator<char>_>::value<float>(data);
    it.
    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    .scope._0_4_ = tVar8;
    json::basic_writer<char,16ul>::value<float_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(float *)&it);
    break;
  case double_number:
    ptVar9 = (pointer)dynamic::basic_variable<std::allocator<char>_>::value<double>(data);
    it.
    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    .scope = ptVar9;
    json::basic_writer<char,16ul>::value<double_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(double *)&it);
    break;
  case long_double_number:
    dynamic::basic_variable<std::allocator<char>_>::value<long_double>
              ((type_conflict10 *)data,this_00);
    json::basic_writer<char,16ul>::value<long_double_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(longdouble *)&it);
    break;
  case string:
    dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::string>((type *)&it,data);
    json::basic_writer<char,16ul>::value<std::__cxx11::string_const&>
              ((basic_writer<char,16ul> *)&ar->writer,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
    std::__cxx11::string::~string((string *)&it);
    break;
  case wstring:
  case u16string:
  case u32string:
    this = (error *)__cxa_allocate_exception(0x20);
    json::error::error(this,incompatible_type);
    __cxa_throw(this,&json::error::typeinfo,std::system_error::~system_error);
  case array:
    json::basic_writer<char,_16UL>::begin_array_value(&ar->writer);
    dynamic::basic_variable<std::allocator<char>_>::begin(&it,data);
    dynamic::basic_variable<std::allocator<char>_>::end(&__end4,data);
    while (bVar1 = dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                             (&it,&__end4), bVar1) {
      pbVar7 = dynamic::basic_variable<std::allocator<char>_>::
               iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
               ::value(&it.
                        super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      );
      save(ar,pbVar7,protocol_version);
      dynamic::basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::operator++(&it.
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  );
    }
    dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
    ::~small_union(&__end4.
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    .current);
    dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
    ::~small_union(&it.
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    .current);
    json::basic_writer<char,_16UL>::end_array_value(&ar->writer);
    break;
  case map:
    json::basic_writer<char,_16UL>::begin_object_value(&ar->writer);
    dynamic::basic_variable<std::allocator<char>_>::begin(&it,data);
    while( true ) {
      dynamic::basic_variable<std::allocator<char>_>::end(&__end4,data);
      bVar1 = dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                        (&it,&__end4);
      dynamic::detail::
      small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
      ::~small_union(&__end4.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current);
      if (!bVar1) break;
      pbVar7 = dynamic::basic_variable<std::allocator<char>_>::
               iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
               ::key(&it.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    );
      save(ar,pbVar7,protocol_version);
      pbVar7 = dynamic::basic_variable<std::allocator<char>_>::
               iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
               ::value(&it.
                        super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      );
      save(ar,pbVar7,protocol_version);
      dynamic::basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::operator++(&it.
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  );
    }
    dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
    ::~small_union(&it.
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    .current);
    json::basic_writer<char,_16UL>::end_object_value(&ar->writer);
  }
  return;
}

Assistant:

static void save(protocol::json::basic_oarchive<CharT>& ar,
                     const dynamic::variable& data,
                     const unsigned int protocol_version)
    {
        switch (data.code())
        {
        case dynamic::code::null:
            ar.template save<json::token::null>();
            break;

        case dynamic::code::boolean:
            ar.save(data.value<bool>());
            break;

        case dynamic::code::signed_char:
            ar.save(data.value<signed char>());
            break;

        case dynamic::code::unsigned_char:
            ar.save(data.value<unsigned char>());
            break;

        case dynamic::code::signed_short_integer:
            ar.save(data.value<signed short int>());
            break;

        case dynamic::code::unsigned_short_integer:
            ar.save(data.value<unsigned short int>());
            break;

        case dynamic::code::signed_integer:
            ar.save(data.value<signed int>());
            break;

        case dynamic::code::unsigned_integer:
            ar.save(data.value<unsigned int>());
            break;

        case dynamic::code::signed_long_integer:
            ar.save(data.value<signed long int>());
            break;

        case dynamic::code::unsigned_long_integer:
            ar.save(data.value<unsigned long int>());
            break;

        case dynamic::code::signed_long_long_integer:
            ar.save(data.value<signed long long int>());
            break;

        case dynamic::code::unsigned_long_long_integer:
            ar.save(data.value<unsigned long long int>());
            break;

        case dynamic::code::real:
            ar.save(data.value<float>());
            break;

        case dynamic::code::long_real:
            ar.save(data.value<double>());
            break;

        case dynamic::code::long_long_real:
            ar.save(data.value<long double>());
            break;

        case dynamic::code::string:
            ar.save(data.value<dynamic::string>());
            break;

        case dynamic::code::wstring:
        case dynamic::code::u16string:
        case dynamic::code::u32string:
            throw json::error(json::incompatible_type);

        case dynamic::code::array:
            ar.template save<json::token::begin_array>();
            for (const auto& item : data)
            {
                ar.save_override(item, protocol_version);
            }
            ar.template save<json::token::end_array>();
            break;

        case dynamic::code::map:
            ar.template save<json::token::begin_object>();
            for (auto it = data.begin(); it != data.end(); ++it)
            {
                ar.save_override(it.key(), protocol_version);
                ar.save_override(it.value(), protocol_version);
            }
            ar.template save<json::token::end_object>();
            break;
        }
    }